

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsView::scrollContentsBy(QGraphicsView *this,int dx,int dy)

{
  Representation *pRVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  ViewportUpdateMode VVar7;
  QGraphicsViewPrivate *this_00;
  QRegionData *pQVar8;
  char cVar9;
  LayoutDirection LVar10;
  int iVar11;
  QWidget *rect;
  QWidget *pQVar12;
  undefined4 in_register_00000034;
  int dx_00;
  long in_FS_OFFSET;
  double dVar13;
  undefined1 auVar14 [16];
  QRegion exposedScaled;
  QRegion exposed;
  QRegion rubberBandRegion;
  QRegion local_98;
  QRegion local_90;
  QRegion local_88;
  undefined8 local_80;
  long local_38;
  
  pQVar12 = (QWidget *)CONCAT44(in_register_00000034,dx);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  uVar6 = *(uint *)&this_00->field_0x300;
  *(uint *)&this_00->field_0x300 = uVar6 | 0x20;
  if ((uVar6 >> 8 & 1) != 0) goto LAB_00637052;
  LVar10 = QWidget::layoutDirection((QWidget *)this);
  dx_00 = -dx;
  if (LVar10 != RightToLeft) {
    dx_00 = dx;
  }
  VVar7 = this_00->viewportUpdateMode;
  if (VVar7 == FullViewportUpdate) {
LAB_00636e0f:
    QWidget::update((this_00->super_QAbstractScrollAreaPrivate).viewport);
    this_00->field_0x301 = this_00->field_0x301 | 0x10;
    (this_00->dirtyBoundingRect).x1 = 0;
    (this_00->dirtyBoundingRect).y1 = 0;
    (this_00->dirtyBoundingRect).x2 = -1;
    (this_00->dirtyBoundingRect).y2 = -1;
    QRegion::QRegion(&stack0xffffffffffffff78);
    pQVar8 = (this_00->dirtyRegion).d;
    (this_00->dirtyRegion).d = local_88.d;
    local_88.d = pQVar8;
    QRegion::~QRegion(&stack0xffffffffffffff78);
  }
  else if (VVar7 != NoViewportUpdate) {
    if ((this_00->field_0x300 & 0x40) == 0) goto LAB_00636e0f;
    uVar2 = (this_00->rubberBandRect).x1;
    uVar4 = (this_00->rubberBandRect).y1;
    uVar3 = (this_00->rubberBandRect).x2;
    uVar5 = (this_00->rubberBandRect).y2;
    auVar14._0_4_ = -(uint)((int)uVar3 < (int)uVar2);
    auVar14._4_4_ = auVar14._0_4_;
    auVar14._8_4_ = -(uint)((int)uVar5 < (int)uVar4);
    auVar14._12_4_ = -(uint)((int)uVar5 < (int)uVar4);
    iVar11 = movmskpd(VVar7,auVar14);
    if (iVar11 == 0) {
      local_88.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      rect = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QGraphicsViewPrivate::rubberBandRegion
                ((QGraphicsViewPrivate *)&stack0xffffffffffffff78,pQVar12,(QRect *)rect);
      QRegion::translated((int)&local_90,(int)(QGraphicsViewPrivate *)&stack0xffffffffffffff78);
      QRegion::operator+=(&stack0xffffffffffffff78,&local_90);
      QRegion::~QRegion(&local_90);
      pQVar12 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QWidget::update(pQVar12,&stack0xffffffffffffff78);
      QRegion::~QRegion(&stack0xffffffffffffff78);
    }
    (this_00->dirtyScrollOffset).xp.m_i = (this_00->dirtyScrollOffset).xp.m_i + dx_00;
    pRVar1 = &(this_00->dirtyScrollOffset).yp;
    pRVar1->m_i = pRVar1->m_i + dy;
    QRegion::translate((int)this_00 + 0x528,dx_00);
    pQVar12 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    QWidget::scroll(pQVar12,dx_00,dy);
  }
  QGraphicsViewPrivate::updateLastCenterPoint(this_00);
  if (((this_00->cacheMode).super_QFlagsStorageHelper<QGraphicsView::CacheModeFlag,_4>.
       super_QFlagsStorage<QGraphicsView::CacheModeFlag>.i & 1) != 0) {
    dVar13 = (double)QPixmap::devicePixelRatio();
    local_90.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&local_90);
    cVar9 = QPixmap::isNull();
    if (cVar9 == '\0') {
      _local_88 = QPixmap::rect();
      QPixmap::scroll((int)this_00 + 0x4f0,(int)((double)dx_00 * dVar13),
                      (QRect *)(ulong)(uint)(int)((double)dy * dVar13),&stack0xffffffffffffff78);
    }
    QRegion::translate((int)&this_00->backgroundPixmapExposed,dx_00);
    local_98.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QTransform::fromScale(1.0 / dVar13,1.0 / dVar13);
    QTransform::map(&local_98);
    QRegion::operator+=(&this_00->backgroundPixmapExposed,&local_98);
    QRegion::~QRegion(&local_98);
    QRegion::~QRegion(&local_90);
  }
  if ((this_00->field_0x300 & 1) != 0) {
    QGraphicsViewPrivate::replayLastMouseEvent(this_00);
  }
LAB_00637052:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::scrollContentsBy(int dx, int dy)
{
    Q_D(QGraphicsView);
    d->dirtyScroll = true;
    if (d->transforming)
        return;
    if (isRightToLeft())
        dx = -dx;

    if (d->viewportUpdateMode != QGraphicsView::NoViewportUpdate) {
        if (d->viewportUpdateMode != QGraphicsView::FullViewportUpdate) {
            if (d->accelerateScrolling) {
#if QT_CONFIG(rubberband)
                // Update new and old rubberband regions
                if (!d->rubberBandRect.isEmpty()) {
                    QRegion rubberBandRegion(d->rubberBandRegion(viewport(), d->rubberBandRect));
                    rubberBandRegion += rubberBandRegion.translated(-dx, -dy);
                    viewport()->update(rubberBandRegion);
                }
#endif
                d->dirtyScrollOffset.rx() += dx;
                d->dirtyScrollOffset.ry() += dy;
                d->dirtyRegion.translate(dx, dy);
                viewport()->scroll(dx, dy);
            } else {
                d->updateAll();
            }
        } else {
            d->updateAll();
        }
    }

    d->updateLastCenterPoint();

    if (d->cacheMode & CacheBackground) {
        // Below, QPixmap::scroll() works in device pixels, while the delta values
        // and backgroundPixmapExposed are in device independent pixels.
        const qreal dpr = d->backgroundPixmap.devicePixelRatio();
        const qreal inverseDpr = qreal(1) / dpr;

        // Scroll the background pixmap
        QRegion exposed;
        if (!d->backgroundPixmap.isNull())
            d->backgroundPixmap.scroll(dx * dpr, dy * dpr, d->backgroundPixmap.rect(), &exposed);

        // Invalidate the background pixmap
        d->backgroundPixmapExposed.translate(dx, dy);
        const QRegion exposedScaled = QTransform::fromScale(inverseDpr, inverseDpr).map(exposed);
        d->backgroundPixmapExposed += exposedScaled;
    }

    // Always replay on scroll.
    if (d->sceneInteractionAllowed)
        d->replayLastMouseEvent();
}